

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void sendChangeRecursively(QWidget *widget,Type type)

{
  QWidgetPrivate *pQVar1;
  QObject *o;
  qsizetype qVar2;
  Type in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  int i;
  QWidgetPrivate *d;
  QEvent e;
  QWidget *in_stack_ffffffffffffffc0;
  int local_34;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_18,in_ESI);
  QCoreApplication::sendEvent(in_RDI,(QEvent *)&local_18);
  pQVar1 = QWidgetPrivate::get((QWidget *)0x3b7a8a);
  local_34 = 0;
  while( true ) {
    o = (QObject *)(long)local_34;
    qVar2 = QList<QObject_*>::size((QList<QObject_*> *)&pQVar1->field_0x18);
    if (qVar2 <= (long)o) break;
    QList<QObject_*>::at((QList<QObject_*> *)in_stack_ffffffffffffffc0,(qsizetype)o);
    in_stack_ffffffffffffffc0 = qobject_cast<QWidget*>(o);
    if (in_stack_ffffffffffffffc0 != (QWidget *)0x0) {
      sendChangeRecursively
                ((QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),(Type)((ulong)pQVar1 >> 0x20)
                );
    }
    local_34 = local_34 + 1;
  }
  QEvent::~QEvent((QEvent *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void sendChangeRecursively(QWidget *widget, QEvent::Type type)
{
    QEvent e(type);
    QCoreApplication::sendEvent(widget, &e);
    QWidgetPrivate *d = QWidgetPrivate::get(widget);
    for (int i = 0; i < d->children.size(); ++i) {
        QWidget *w = qobject_cast<QWidget *>(d->children.at(i));
        if (w)
            sendChangeRecursively(w, type);
    }
}